

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringSaver.cpp
# Opt level: O0

StringRef __thiscall llvm::UniqueStringSaver::save(UniqueStringSaver *this,StringRef S)

{
  StringRef *pSVar1;
  StringRef SVar2;
  char *local_58;
  size_t local_50;
  undefined1 local_48 [8];
  pair<llvm::detail::DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>::Iterator,_bool>
  R;
  UniqueStringSaver *this_local;
  StringRef S_local;
  
  S_local.Data = (char *)S.Length;
  this_local = (UniqueStringSaver *)S.Data;
  R._16_8_ = this;
  detail::
  DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>
  ::insert((pair<llvm::detail::DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>::Iterator,_bool>
            *)local_48,
           (DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>
            *)(this + 8),(StringRef *)&this_local);
  if (((byte)R.first.I.End & 1) != 0) {
    SVar2.Length = (size_t)S_local.Data;
    SVar2.Data = (char *)this_local;
    SVar2 = StringSaver::save((StringSaver *)this,SVar2);
    pSVar1 = detail::
             DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>
             ::Iterator::operator*((Iterator *)local_48);
    local_58 = SVar2.Data;
    pSVar1->Data = local_58;
    local_50 = SVar2.Length;
    pSVar1->Length = local_50;
  }
  pSVar1 = detail::
           DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>
           ::Iterator::operator*((Iterator *)local_48);
  return *pSVar1;
}

Assistant:

StringRef UniqueStringSaver::save(StringRef S) {
  auto R = Unique.insert(S);
  if (R.second)                 // cache miss, need to actually save the string
    *R.first = Strings.save(S); // safe replacement with equal value
  return *R.first;
}